

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedbackOverflowQueryErrorIncompatibleTarget::deinit
          (TransformFeedbackOverflowQueryErrorIncompatibleTarget *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  TransformFeedbackOverflowQueryErrorIncompatibleTarget *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryErrorBase).
                      super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x458))(1,&this->m_incompatible_query);
  (**(code **)(lVar4 + 0x458))(1,&this->m_overflow_query);
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (bVar1) {
    (**(code **)(lVar4 + 0x458))(1,&this->m_stream_overflow_query);
  }
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

virtual void deinit()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.deleteQueries(1, &m_incompatible_query);

		gl.deleteQueries(1, &m_overflow_query);

		if (supportsTransformFeedback3())
		{
			gl.deleteQueries(1, &m_stream_overflow_query);
		}

		TransformFeedbackOverflowQueryErrorBase::deinit();
	}